

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

void __thiscall
llvm::sys::fs::directory_entry::replace_filename
          (directory_entry *this,Twine *filename,basic_file_status st)

{
  undefined8 a;
  char *pcVar1;
  StringRef path_00;
  StringRef local_150;
  string local_140;
  Twine local_120;
  Twine local_108;
  Twine local_f0;
  path *local_d8;
  StringRef local_c8;
  undefined1 local_b8 [8];
  SmallString<128U> path;
  Twine *filename_local;
  directory_entry *this_local;
  
  path.super_SmallVector<char,_128U>.super_SmallVectorStorage<char,_128U>.InlineElts._120_8_ =
       filename;
  local_d8 = (path *)std::__cxx11::string::data();
  pcVar1 = (char *)std::__cxx11::string::length();
  path_00.Length = 2;
  path_00.Data = pcVar1;
  local_c8 = sys::path::parent_path(local_d8,path_00,(Style)pcVar1);
  SmallString<128U>::SmallString((SmallString<128U> *)local_b8,local_c8);
  a = path.super_SmallVector<char,_128U>.super_SmallVectorStorage<char,_128U>.InlineElts._120_8_;
  Twine::Twine(&local_f0,"");
  Twine::Twine(&local_108,"");
  Twine::Twine(&local_120,"");
  sys::path::append((SmallVectorImpl<char> *)local_b8,(Twine *)a,&local_f0,&local_108,&local_120);
  local_150 = SmallString<128U>::str((SmallString<128U> *)local_b8);
  StringRef::operator_cast_to_string(&local_140,&local_150);
  std::__cxx11::string::operator=((string *)this,(string *)&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  memcpy(&this->Status,&st,0x30);
  SmallString<128U>::~SmallString((SmallString<128U> *)local_b8);
  return;
}

Assistant:

void directory_entry::replace_filename(const Twine &filename,
                                       basic_file_status st) {
  SmallString<128> path = path::parent_path(Path);
  path::append(path, filename);
  Path = path.str();
  Status = st;
}